

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O0

lineiter_t * lineiter_start_clean(FILE *fh)

{
  FILE *local_20;
  lineiter_t *li;
  FILE *fh_local;
  
  local_20 = (FILE *)lineiter_start(fh);
  fh_local = local_20;
  if (local_20 != (FILE *)0x0) {
    *(int32 *)&local_20->_IO_read_base = 1;
    if ((*(long *)local_20 == 0) || (**(char **)local_20 != '#')) {
      string_trim(*(char **)local_20,STRING_BOTH);
    }
    else {
      local_20 = (FILE *)lineiter_next((lineiter_t *)local_20);
    }
    fh_local = local_20;
  }
  return (lineiter_t *)fh_local;
}

Assistant:

lineiter_t *
lineiter_start_clean(FILE *fh)
{
    lineiter_t *li;
    
    li = lineiter_start(fh);
    
    if (li == NULL)
	return li;
    
    li->clean = TRUE;
    
    if (li->buf && li->buf[0] == '#') {
	li = lineiter_next(li);
    } else {
	string_trim(li->buf, STRING_BOTH);
    }
    
    return li;
}